

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall TextEntry::TextEntry(TextEntry *this,char *initial_text)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  Widget *in_RDI;
  
  Widget::Widget(in_RDI);
  in_RDI->_vptr_Widget = (_func_int **)&PTR__TextEntry_00114ae0;
  *(undefined1 *)&in_RDI[1].grid_x = 0;
  in_RDI[1].grid_y = 0;
  in_RDI[1].grid_w = 0;
  pp_Var1 = (_func_int **)al_ustr_new(in_RSI);
  in_RDI[1]._vptr_Widget = pp_Var1;
  return;
}

Assistant:

TextEntry::TextEntry(const char *initial_text) :
   focused(false),
   cursor_pos(0),
   left_pos(0)
{
   text = al_ustr_new(initial_text);
}